

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncodeParams.h
# Opt level: O2

void __thiscall o3dgc::SC3DMCEncodeParams::SC3DMCEncodeParams(SC3DMCEncodeParams *this)

{
  unsigned_long a_1;
  unsigned_long a;
  long lVar1;
  
  memset(this,0,0x1028);
  this->m_encodeMode = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
  this->m_streamTypeMode = O3DGC_STREAM_TYPE_ASCII;
  this->m_coordQuantBits = 0xe;
  this->m_normalQuantBits = 8;
  this->m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
  this->m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    this->m_floatAttributePredMode[lVar1] = O3DGC_SC3DMC_DIFFERENTIAL_PREDICTION;
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    this->m_intAttributePredMode[lVar1] = O3DGC_SC3DMC_NO_PREDICTION;
  }
  return;
}

Assistant:

SC3DMCEncodeParams(void)
                                    {
                                        memset(this, 0, sizeof(SC3DMCEncodeParams));
                                        m_encodeMode        = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
                                        m_streamTypeMode    = O3DGC_STREAM_TYPE_ASCII;
                                        m_coordQuantBits    = 14;
                                        m_normalQuantBits   = 8;
                                        m_coordPredMode     = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
                                        m_normalPredMode    = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
                                        for(unsigned long a = 0; a < O3DGC_SC3DMC_MAX_NUM_FLOAT_ATTRIBUTES; ++a)
                                        {
                                            m_floatAttributePredMode[a] = O3DGC_SC3DMC_DIFFERENTIAL_PREDICTION;
                                        }
                                        for(unsigned long a = 0; a < O3DGC_SC3DMC_MAX_NUM_INT_ATTRIBUTES; ++a)
                                        {
                                            m_intAttributePredMode[a] = O3DGC_SC3DMC_NO_PREDICTION;
                                        }
                                    }